

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::jsr(Code *this,Param *target)

{
  uint16_t uVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  uVar1 = Param::getMXn(target);
  add_word(this,uVar1 + 0x4e80);
  (*target->_vptr_Param[2])(&local_30,target);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return this;
}

Assistant:

Code& Code::jsr(const Param& target)
{
    uint16_t opcode = 0x4E80 + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}